

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O2

ssize_t __thiscall
libnbt::NBTTagCompound::write(NBTTagCompound *this,int __fd,void *__buf,size_t __n)

{
  _Hash_node_base *p_Var1;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  ostream *out;
  __node_base *p_Var2;
  int16_t size;
  
  out = (ostream *)CONCAT44(in_register_00000034,__fd);
  p_Var2 = &(this->map)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    p_Var1 = p_Var2[5]._M_nxt;
    (*(code *)p_Var1->_M_nxt[2]._M_nxt)(p_Var1);
    std::ostream::put((char)__fd);
    size = *(int16_t *)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
    writeBytes(out,(char *)&size,'\x02');
    std::ostream::write((char *)out,(long)p_Var2[1]._M_nxt);
    (*(code *)p_Var1->_M_nxt[1]._M_nxt)(p_Var1,out);
    in_RAX = (*(code *)p_Var1->_M_nxt[2]._M_nxt)(p_Var1);
    if ((char)in_RAX == '\n') {
      in_RAX = std::ostream::put((char)__fd);
    }
  }
  return in_RAX;
}

Assistant:

void NBTTagCompound::write(std::ostream &out) {
        auto i = map.begin();
        for (; i != map.end(); i++) {
            auto *nbt = i->second;
            out.put(nbt->getType());
            auto size = (int16_t) i->first.size();
            writeBytes(out, (char *) &size, 2);
            out.write(i->first.c_str(), size);
            nbt->write(out);
            if (nbt->getType() == COMPOUND) {
                out.put(END);
            }
        }
    }